

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O2

shared_ptr<Foo> __thiscall
squall::detail::Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0>::doit
          (Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0> *this,HSQUIRRELVM vm,
          SQInteger index)

{
  undefined8 *in_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Foo> sVar1;
  SQUserPointer r;
  undefined8 *local_28;
  
  local_28 = in_RAX;
  check_argument_type<(squall::detail::FetchContext)0>(vm,index,OT_USERDATA);
  sq_getuserdata(vm,index,&local_28,(SQUserPointer *)0x0);
  std::__shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2> *)*local_28);
  sVar1.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Foo>)sVar1.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static T doit(HSQUIRRELVM vm, SQInteger index) {
        check_argument_type<FC>(vm, index, OT_USERDATA);
        SQUserPointer r;
        sq_getuserdata(vm, index, &r, NULL);
        return **((T**)r);
    }